

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressdialog.cpp
# Opt level: O0

void __thiscall QProgressDialogPrivate::adoptChildWidget(QProgressDialogPrivate *this,QWidget *c)

{
  QWidget *pQVar1;
  QWidget *pQVar2;
  QProgressDialogPrivate *in_RSI;
  QProgressDialogPrivate *in_RDI;
  long in_FS_OFFSET;
  QProgressDialog *q;
  QProgressDialogPrivate *in_stack_00000050;
  QWidget *in_stack_00000078;
  QWidget *in_stack_00000080;
  WindowFlags in_stack_000001c0;
  QProgressDialogPrivate *in_stack_ffffffffffffffc0;
  undefined1 local_c [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (QWidget *)q_func(in_RDI);
  if (in_RSI != (QProgressDialogPrivate *)0x0) {
    pQVar2 = QWidget::parentWidget((QWidget *)0x7b1426);
    if (pQVar2 == pQVar1) {
      QWidget::hide((QWidget *)0x7b1437);
    }
    else {
      in_stack_ffffffffffffffc0 = in_RSI;
      memset(local_c,0,4);
      QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x7b1468);
      QWidget::setParent(in_stack_00000080,in_stack_00000078,in_stack_000001c0);
    }
  }
  ensureSizeIsAtLeastSizeHint(in_stack_ffffffffffffffc0);
  layout(in_stack_00000050);
  if (in_RSI != (QProgressDialogPrivate *)0x0) {
    QWidget::show((QWidget *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QProgressDialogPrivate::adoptChildWidget(QWidget *c)
{
    Q_Q(QProgressDialog);

    if (c) {
        if (c->parentWidget() == q)
            c->hide(); // until after ensureSizeIsAtLeastSizeHint()
        else
            c->setParent(q, { });
    }
    ensureSizeIsAtLeastSizeHint();
    //The layout should be updated again to prevent layout errors when the new 'widget' is replaced
    layout();
    if (c)
        c->show();
}